

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O2

void __thiscall HttpData::HttpData(HttpData *this,EventLoop *loop,int connfd)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  Channel *this_00;
  function<void_()> local_68;
  _Bind<void_(HttpData::*(HttpData_*))()> local_48;
  
  (this->super_enable_shared_from_this<HttpData>)._M_weak_this.
  super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<HttpData>)._M_weak_this.
  super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->loop_ = loop;
  this_00 = (Channel *)operator_new(0xa8);
  Channel::Channel(this_00,loop,connfd);
  std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
            ((__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> *)&this->channel_,this_00);
  this->fd_ = connfd;
  (this->inBuffer_)._M_dataplus._M_p = (pointer)&(this->inBuffer_).field_2;
  (this->inBuffer_)._M_string_length = 0;
  (this->inBuffer_).field_2._M_local_buf[0] = '\0';
  (this->outBuffer_)._M_dataplus._M_p = (pointer)&(this->outBuffer_).field_2;
  (this->outBuffer_)._M_string_length = 0;
  (this->outBuffer_).field_2._M_local_buf[0] = '\0';
  this->error_ = false;
  this->connectionState_ = H_CONNECTED;
  this->method_ = METHOD_GET;
  this->HTTPVersion_ = HTTP_11;
  (this->fileName_)._M_dataplus._M_p = (pointer)&(this->fileName_).field_2;
  (this->fileName_)._M_string_length = 0;
  (this->fileName_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  this->keepAlive_ = false;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._M_f = (offset_in_HttpData_to_subr)handleRead;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_HttpData_*>.super__Head_base<0UL,_HttpData_*,_false>
  ._M_head_impl = (_Tuple_impl<0UL,_HttpData_*>)(_Tuple_impl<0UL,_HttpData_*>)this;
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void()> *)&local_68,&local_48);
  std::function<void_()>::operator=(&peVar2->readHandler_,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._M_f = (offset_in_HttpData_to_subr)handleWrite;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_HttpData_*>.super__Head_base<0UL,_HttpData_*,_false>
  ._M_head_impl = (_Tuple_impl<0UL,_HttpData_*>)(_Tuple_impl<0UL,_HttpData_*>)this;
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void()> *)&local_68,&local_48);
  std::function<void_()>::operator=(&peVar2->writeHandler_,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._M_f = (offset_in_HttpData_to_subr)handleConn;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_HttpData_*>.super__Head_base<0UL,_HttpData_*,_false>
  ._M_head_impl = (_Tuple_impl<0UL,_HttpData_*>)(_Tuple_impl<0UL,_HttpData_*>)this;
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void()> *)&local_68,&local_48);
  std::function<void_()>::operator=(&peVar2->connHandler_,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  return;
}

Assistant:

HttpData::HttpData(EventLoop* loop, int connfd)
        :loop_(loop),
        channel_(new Channel(loop,connfd)),
        fd_(connfd),
        error_(false),
        connectionState_(H_CONNECTED),
        method_(METHOD_GET),
        HTTPVersion_(HTTP_11),
        nowReadPos_(0),
        state_(STATE_PARSE_URI),
        hState_(H_START),
        keepAlive_(false) {
            channel_->setReadHandler(bind(&HttpData::handleRead, this));
            channel_->setWriteHandler(bind(&HttpData::handleWrite, this));
            channel_->setConnHandler(bind(&HttpData::handleConn, this));
}